

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     inc<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,Context *context)

{
  uchar uVar1;
  
  uVar1 = *destination;
  *destination = uVar1 + '\x01';
  (context->flags).overflow_ = (uint)((uchar)(uVar1 + '\x01') == 0x80);
  (context->flags).auxiliary_carry_ = (*destination - 1 ^ (uint)*destination) & 0x10;
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,*destination);
  return;
}

Assistant:

void inc(
	modify_t<IntT> destination,
	ContextT &context
) {
	/*
		DEST ← DEST + 1;
	*/
	/*
		The CF flag is not affected.
		The OF, SF, ZF, AF, and PF flags are set according to the result.
	*/
	++destination;

	context.flags.template set_from<Flag::Overflow>(destination == Numeric::top_bit<IntT>());
	context.flags.template set_from<Flag::AuxiliaryCarry>(((destination - 1) ^ destination) & 0x10);
	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(destination);
}